

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
write_double_sprintf<long_double>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,longdouble value,format_specs *spec,basic_buffer<wchar_t> *buffer)

{
  bool bVar1;
  int iVar2;
  wchar_t wVar3;
  type tVar4;
  size_t sVar5;
  wchar_t *buffer_00;
  char_type *pcVar6;
  uint n;
  int result;
  size_t buffer_size;
  char_type *start;
  char_type *format_ptr;
  char_type format [10];
  basic_buffer<wchar_t> *buffer_local;
  format_specs *spec_local;
  longdouble value_local;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> *this_local;
  
  sVar5 = internal::basic_buffer<wchar_t>::capacity(buffer);
  if (sVar5 != 0) {
    start = (char_type *)((long)&format_ptr + 4);
    format_ptr._0_4_ = 0x25;
    bVar1 = basic_format_specs<wchar_t>::flag(spec,8);
    if (bVar1) {
      pcVar6 = start + 1;
      *start = 0x23;
      start = pcVar6;
    }
    iVar2 = basic_format_specs<wchar_t>::precision(spec);
    if (-1 < iVar2) {
      pcVar6 = start + 1;
      *start = 0x2e;
      start = start + 2;
      *pcVar6 = 0x2a;
    }
    append_float_length(this,&start,value);
    wVar3 = basic_format_specs<wchar_t>::type(spec);
    *start = wVar3;
    start[1] = 0;
    start = start + 1;
    while( true ) {
      while( true ) {
        sVar5 = internal::basic_buffer<wchar_t>::capacity(buffer);
        buffer_00 = internal::basic_buffer<wchar_t>::operator[](buffer,0);
        iVar2 = basic_format_specs<wchar_t>::precision(spec);
        iVar2 = internal::char_traits<wchar_t>::format_float<long_double>
                          (buffer_00,sVar5,(wchar_t *)&format_ptr,iVar2,value);
        if (-1 < iVar2) break;
        sVar5 = internal::basic_buffer<wchar_t>::capacity(buffer);
        internal::basic_buffer<wchar_t>::reserve(buffer,sVar5 + 1);
      }
      tVar4 = internal::to_unsigned<int>(iVar2);
      sVar5 = internal::basic_buffer<wchar_t>::capacity(buffer);
      if (tVar4 < sVar5) break;
      internal::basic_buffer<wchar_t>::reserve(buffer,(ulong)(tVar4 + 1));
    }
    internal::basic_buffer<wchar_t>::resize(buffer,(ulong)tVar4);
    return;
  }
  __assert_fail("(buffer.capacity() != 0) && \"empty buffer\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fireice-uk[P]gulps/./fmt/format.h"
                ,0xba7,
                "void fmt::basic_writer<fmt::back_insert_range<fmt::internal::basic_buffer<wchar_t>>>::write_double_sprintf(T, const format_specs &, internal::basic_buffer<char_type> &) [Range = fmt::back_insert_range<fmt::internal::basic_buffer<wchar_t>>, T = long double]"
               );
}

Assistant:

void basic_writer<Range>::write_double_sprintf(
    T value, const format_specs &spec,
    internal::basic_buffer<char_type>& buffer) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buffer.capacity() != 0, "empty buffer");

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  char_type format[MAX_FORMAT_SIZE];
  char_type *format_ptr = format;
  *format_ptr++ = '%';
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = spec.type();
  *format_ptr = '\0';

  // Format using snprintf.
  char_type *start = FMT_NULL;
  for (;;) {
    std::size_t buffer_size = buffer.capacity();
    start = &buffer[0];
    int result = internal::char_traits<char_type>::format_float(
        start, buffer_size, format, spec.precision(), value);
    if (result >= 0) {
      unsigned n = internal::to_unsigned(result);
      if (n < buffer.capacity()) {
        buffer.resize(n);
        break;  // The buffer is large enough - continue with formatting.
      }
      buffer.reserve(n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer.reserve(buffer.capacity() + 1);
    }
  }
}